

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VLinearCombination_Serial(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  uint uVar1;
  long lVar2;
  N_Vector p_Var3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (nvec < 1) {
    return -1;
  }
  if (nvec == 2) {
    N_VLinearSum_Serial(*c,*X,c[1],X[1],z);
  }
  else if (nvec == 1) {
    N_VScale_Serial(*c,*X,z);
  }
  else {
    uVar1 = *z->content;
    uVar7 = (ulong)uVar1;
    lVar2 = *(long *)((long)z->content + 8);
    p_Var3 = *X;
    if (p_Var3 == z) {
      if ((*c == 1.0) && (!NAN(*c))) {
        if (nvec == 1) {
          return 0;
        }
        uVar5 = 1;
        do {
          if (0 < (int)uVar1) {
            lVar4 = *(long *)((long)X[uVar5]->content + 8);
            uVar6 = 0;
            do {
              *(double *)(lVar2 + uVar6 * 8) =
                   c[uVar5] * *(double *)(lVar4 + uVar6 * 8) + *(double *)(lVar2 + uVar6 * 8);
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)nvec);
        return 0;
      }
      if (p_Var3 == z) {
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            *(double *)(lVar2 + uVar5 * 8) = *c * *(double *)(lVar2 + uVar5 * 8);
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        if (nvec == 1) {
          return 0;
        }
        uVar5 = 2;
        if (2 < nvec) {
          uVar5 = (ulong)(uint)nvec;
        }
        uVar6 = 1;
        do {
          if (0 < (int)uVar1) {
            lVar4 = *(long *)((long)X[uVar6]->content + 8);
            uVar8 = 0;
            do {
              *(double *)(lVar2 + uVar8 * 8) =
                   c[uVar6] * *(double *)(lVar4 + uVar8 * 8) + *(double *)(lVar2 + uVar8 * 8);
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar5);
        return 0;
      }
    }
    if (0 < (int)uVar1) {
      lVar4 = *(long *)((long)p_Var3->content + 8);
      uVar5 = 0;
      do {
        *(double *)(lVar2 + uVar5 * 8) = *c * *(double *)(lVar4 + uVar5 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    if (nvec != 1) {
      uVar5 = 2;
      if (2 < nvec) {
        uVar5 = (ulong)(uint)nvec;
      }
      uVar6 = 1;
      do {
        if (0 < (int)uVar1) {
          lVar4 = *(long *)((long)X[uVar6]->content + 8);
          uVar8 = 0;
          do {
            *(double *)(lVar2 + uVar8 * 8) =
                 c[uVar6] * *(double *)(lVar4 + uVar8 * 8) + *(double *)(lVar2 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar5);
    }
  }
  return 0;
}

Assistant:

int N_VLinearCombination_Serial(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], z);
    return(0);
  }

  /* should have called N_VLinearSum */
  if (nvec == 2) {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE)) {
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z) {
    for (j=0; j<N; j++) {
      zd[j] *= c[0];
    }
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j=0; j<N; j++) {
    zd[j] = c[0] * xd[j];
  }
  for (i=1; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<N; j++) {
      zd[j] += c[i] * xd[j];
    }
  }
  return(0);
}